

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateFtest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  pointer pnVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  cpp_dec_float<100U,_int,_void> *pcVar11;
  long lVar12;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  theeps;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint local_148 [3];
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  DIdxSet *local_88;
  DIdxSet *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_48 [2];
  undefined8 uStack_40;
  
  pUVar3 = this->theFvec;
  (this->updateViols).super_IdxSet.num = 0;
  entertol(&local_d8,this);
  lVar12 = (long)(pUVar3->thedelta).super_IdxSet.num;
  if (0 < lVar12) {
    local_88 = &this->updateViols;
    pnVar1 = &this->m_pricingViol;
    local_80 = &this->infeasibilities;
    lVar12 = lVar12 + 1;
    do {
      iVar9 = (pUVar3->thedelta).super_IdxSet.idx[lVar12 + -2];
      if (this->m_pricingViolUpToDate == true) {
        pcVar11 = &(this->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend;
        local_128.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
        local_128.data._M_elems[1] = local_d8.m_backend.data._M_elems[1];
        uVar6 = local_128.data._M_elems._0_8_;
        local_128.data._M_elems[2] = local_d8.m_backend.data._M_elems[2];
        local_128.data._M_elems[3] = local_d8.m_backend.data._M_elems[3];
        local_128.data._M_elems[0xc] = local_d8.m_backend.data._M_elems[0xc];
        local_128.data._M_elems[0xd] = local_d8.m_backend.data._M_elems[0xd];
        local_128.data._M_elems._56_5_ = local_d8.m_backend.data._M_elems._56_5_;
        local_128.data._M_elems[0xf]._1_3_ = local_d8.m_backend.data._M_elems[0xf]._1_3_;
        local_128.data._M_elems[8] = local_d8.m_backend.data._M_elems[8];
        local_128.data._M_elems[9] = local_d8.m_backend.data._M_elems[9];
        local_128.data._M_elems[10] = local_d8.m_backend.data._M_elems[10];
        local_128.data._M_elems[0xb] = local_d8.m_backend.data._M_elems[0xb];
        local_128.data._M_elems[4] = local_d8.m_backend.data._M_elems[4];
        local_128.data._M_elems[5] = local_d8.m_backend.data._M_elems[5];
        local_128.data._M_elems[6] = local_d8.m_backend.data._M_elems[6];
        local_128.data._M_elems[7] = local_d8.m_backend.data._M_elems[7];
        local_128.exp = local_d8.m_backend.exp;
        local_128.neg = local_d8.m_backend.neg;
        local_128.fpclass = local_d8.m_backend.fpclass;
        local_128.prec_elem = local_d8.m_backend.prec_elem;
        local_128.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
        if (local_128.data._M_elems[0] != 0 || local_d8.m_backend.fpclass != cpp_dec_float_finite) {
          local_128.neg = (bool)(local_d8.m_backend.neg ^ 1);
        }
        local_128.data._M_elems._0_8_ = uVar6;
        if ((local_d8.m_backend.fpclass != cpp_dec_float_NaN) &&
           (pcVar11->fpclass != cpp_dec_float_NaN)) {
          iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (pcVar11,&local_128);
          if (iVar8 < 0) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&pnVar1->m_backend,
                       &(this->theCoTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend);
          }
        }
      }
      pnVar4 = (this->theFvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((*(fpclass_type *)((long)(pnVar4 + iVar9) + 0x48) == cpp_dec_float_NaN) ||
         (pnVar5 = (this->theUBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         pnVar5[iVar9].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_003cd319:
        pnVar4 = (this->theFvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar5 = (this->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&pnVar4[iVar9].m_backend,&pnVar5[iVar9].m_backend);
        if (iVar8 < 1) goto LAB_003cd319;
        pnVar4 = (this->theUBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar5 = (this->theFvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      pcVar11 = &pnVar4[iVar9].m_backend;
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems._56_5_ = 0;
      local_128.data._M_elems[0xf]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      if (&local_128 == &pnVar5[iVar9].m_backend) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_128,pcVar11);
        if (local_128.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite) {
          local_128.neg = (bool)(local_128.neg ^ 1);
        }
      }
      else {
        if (&local_128 != pcVar11) {
          local_128.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
          local_128.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
          local_128.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
          local_128.data._M_elems._24_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 6);
          local_128.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
          local_128.data._M_elems._40_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 10);
          local_128.data._M_elems._48_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 0xc);
          uVar6 = *(undefined8 *)((pcVar11->data)._M_elems + 0xe);
          local_128.data._M_elems._56_5_ = SUB85(uVar6,0);
          local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_128.exp = pcVar11->exp;
          local_128.neg = pcVar11->neg;
          local_128.fpclass = pcVar11->fpclass;
          local_128.prec_elem = pcVar11->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_128,&pnVar5[iVar9].m_backend);
      }
      pnVar4 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (uint *)((long)&pnVar4[iVar9].m_backend.data + 0x30);
      *(undefined8 *)puVar2 = local_128.data._M_elems._48_8_;
      *(ulong *)(puVar2 + 2) =
           CONCAT35(local_128.data._M_elems[0xf]._1_3_,local_128.data._M_elems._56_5_);
      puVar2 = (uint *)((long)&pnVar4[iVar9].m_backend.data + 0x20);
      *(undefined8 *)puVar2 = local_128.data._M_elems._32_8_;
      *(undefined8 *)(puVar2 + 2) = local_128.data._M_elems._40_8_;
      puVar2 = (uint *)((long)&pnVar4[iVar9].m_backend.data + 0x10);
      *(undefined8 *)puVar2 = local_128.data._M_elems._16_8_;
      *(undefined8 *)(puVar2 + 2) = local_128.data._M_elems._24_8_;
      *(undefined8 *)&pnVar4[iVar9].m_backend.data = local_128.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar4[iVar9].m_backend.data + 8) = local_128.data._M_elems._8_8_;
      pnVar4[iVar9].m_backend.exp = local_128.exp;
      pnVar4[iVar9].m_backend.neg = local_128.neg;
      pnVar4[iVar9].m_backend.fpclass = local_128.fpclass;
      pnVar4[iVar9].m_backend.prec_elem = local_128.prec_elem;
      if (this->sparsePricingLeave == true) {
        pcVar11 = &(this->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend;
        local_128.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
        local_128.data._M_elems[1] = local_d8.m_backend.data._M_elems[1];
        uVar6 = local_128.data._M_elems._0_8_;
        local_128.data._M_elems[2] = local_d8.m_backend.data._M_elems[2];
        local_128.data._M_elems[3] = local_d8.m_backend.data._M_elems[3];
        local_128.data._M_elems[0xc] = local_d8.m_backend.data._M_elems[0xc];
        local_128.data._M_elems[0xd] = local_d8.m_backend.data._M_elems[0xd];
        local_128.data._M_elems._56_5_ = local_d8.m_backend.data._M_elems._56_5_;
        local_128.data._M_elems[0xf]._1_3_ = local_d8.m_backend.data._M_elems[0xf]._1_3_;
        local_128.data._M_elems[8] = local_d8.m_backend.data._M_elems[8];
        local_128.data._M_elems[9] = local_d8.m_backend.data._M_elems[9];
        local_128.data._M_elems[10] = local_d8.m_backend.data._M_elems[10];
        local_128.data._M_elems[0xb] = local_d8.m_backend.data._M_elems[0xb];
        local_128.data._M_elems[4] = local_d8.m_backend.data._M_elems[4];
        local_128.data._M_elems[5] = local_d8.m_backend.data._M_elems[5];
        local_128.data._M_elems[6] = local_d8.m_backend.data._M_elems[6];
        local_128.data._M_elems[7] = local_d8.m_backend.data._M_elems[7];
        local_128.exp = local_d8.m_backend.exp;
        local_128.neg = local_d8.m_backend.neg;
        local_128.fpclass = local_d8.m_backend.fpclass;
        local_128.prec_elem = local_d8.m_backend.prec_elem;
        local_128.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
        if (local_128.data._M_elems[0] != 0 || local_d8.m_backend.fpclass != cpp_dec_float_finite) {
          local_128.neg = (bool)(local_d8.m_backend.neg ^ 1);
        }
        local_128.data._M_elems._0_8_ = uVar6;
        if ((local_d8.m_backend.fpclass == cpp_dec_float_NaN) ||
           (pcVar11->fpclass == cpp_dec_float_NaN)) goto LAB_003cd4ff;
        iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (pcVar11,&local_128);
        if (-1 < iVar8) goto LAB_003cd4ff;
        if (this->m_pricingViolUpToDate == true) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&pnVar1->m_backend,
                     &(this->theCoTest).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend);
        }
        if ((this->isInfeasible).data[iVar9] == 0) {
          DIdxSet::addIdx(local_80,iVar9);
          (this->isInfeasible).data[iVar9] = 1;
        }
        if (this->hyperPricingLeave == true) {
          DIdxSet::addIdx(local_88,iVar9);
        }
      }
      else {
LAB_003cd4ff:
        if (this->m_pricingViolUpToDate == true) {
          pcVar11 = &(this->theCoTest).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend;
          local_128.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
          local_128.data._M_elems[1] = local_d8.m_backend.data._M_elems[1];
          uVar6 = local_128.data._M_elems._0_8_;
          local_128.data._M_elems[2] = local_d8.m_backend.data._M_elems[2];
          local_128.data._M_elems[3] = local_d8.m_backend.data._M_elems[3];
          local_128.data._M_elems[0xc] = local_d8.m_backend.data._M_elems[0xc];
          local_128.data._M_elems[0xd] = local_d8.m_backend.data._M_elems[0xd];
          local_128.data._M_elems._56_5_ = local_d8.m_backend.data._M_elems._56_5_;
          local_128.data._M_elems[0xf]._1_3_ = local_d8.m_backend.data._M_elems[0xf]._1_3_;
          local_128.data._M_elems[8] = local_d8.m_backend.data._M_elems[8];
          local_128.data._M_elems[9] = local_d8.m_backend.data._M_elems[9];
          local_128.data._M_elems[10] = local_d8.m_backend.data._M_elems[10];
          local_128.data._M_elems[0xb] = local_d8.m_backend.data._M_elems[0xb];
          local_128.data._M_elems[4] = local_d8.m_backend.data._M_elems[4];
          local_128.data._M_elems[5] = local_d8.m_backend.data._M_elems[5];
          local_128.data._M_elems[6] = local_d8.m_backend.data._M_elems[6];
          local_128.data._M_elems[7] = local_d8.m_backend.data._M_elems[7];
          local_128.exp = local_d8.m_backend.exp;
          local_128.neg = local_d8.m_backend.neg;
          local_128.fpclass = local_d8.m_backend.fpclass;
          local_128.prec_elem = local_d8.m_backend.prec_elem;
          local_128.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
          if (local_128.data._M_elems[0] != 0 || local_d8.m_backend.fpclass != cpp_dec_float_finite)
          {
            local_128.neg = (bool)(local_d8.m_backend.neg ^ 1);
          }
          local_128.data._M_elems._0_8_ = uVar6;
          if ((local_d8.m_backend.fpclass != cpp_dec_float_NaN) &&
             (pcVar11->fpclass != cpp_dec_float_NaN)) {
            iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (pcVar11,&local_128);
            if (iVar8 < 0) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&pnVar1->m_backend,
                         &(this->theCoTest).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend);
            }
          }
        }
      }
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
  if (0 < this->boundflips) {
    a = Tolerances::epsilon((this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x10;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems._56_5_ = 0;
    local_128.data._M_elems[0xf]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_128,a);
    pSVar10 = this->solveVector3;
    if (0 < (pSVar10->super_IdxSet).num) {
      pnVar1 = &this->m_pricingViol;
      local_88 = &this->infeasibilities;
      lVar12 = 0;
      do {
        pnVar5 = (pSVar10->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar9 = (pSVar10->super_IdxSet).idx[lVar12];
        pnVar4 = pnVar5 + iVar9;
        local_78 = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
        uStack_70 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + 8);
        puVar2 = (uint *)((long)&pnVar5[iVar9].m_backend.data + 0x10);
        local_68 = *(undefined8 *)puVar2;
        uStack_60 = *(undefined8 *)(puVar2 + 2);
        local_168 = *(undefined1 (*) [16])puVar2;
        puVar2 = (uint *)((long)&pnVar5[iVar9].m_backend.data + 0x20);
        local_58 = *(undefined8 *)puVar2;
        uStack_50 = *(undefined8 *)(puVar2 + 2);
        local_158 = *(undefined1 (*) [16])puVar2;
        puVar2 = (uint *)((long)&pnVar5[iVar9].m_backend.data + 0x30);
        local_148._0_8_ = *(undefined8 *)puVar2;
        uStack_40 = *(undefined8 *)(puVar2 + 2);
        iStack_138 = pnVar5[iVar9].m_backend.exp;
        bStack_134 = pnVar5[iVar9].m_backend.neg;
        local_130._0_4_ = pnVar5[iVar9].m_backend.fpclass;
        local_130._4_4_ = pnVar5[iVar9].m_backend.prec_elem;
        stack0xfffffffffffffec0 = (undefined5)uStack_40;
        uStack_13b = (undefined3)((ulong)uStack_40 >> 0x28);
        if ((bStack_134 == true) &&
           (local_178._0_4_ = (undefined4)local_78,
           local_178._0_4_ != 0 || (fpclass_type)local_130 != cpp_dec_float_finite)) {
          bStack_134 = false;
        }
        if (((fpclass_type)local_130 != cpp_dec_float_NaN) &&
           (local_128.fpclass != cpp_dec_float_NaN)) {
          local_178 = *(undefined1 (*) [16])&(pnVar4->m_backend).data;
          local_48 = (uint  [2])local_148._0_8_;
          iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_178,&local_128);
          if (0 < iVar9) {
            iVar9 = (this->solveVector3->super_IdxSet).idx[lVar12];
            if (this->m_pricingViolUpToDate == true) {
              pcVar11 = &(this->theCoTest).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend;
              local_178._8_4_ = local_d8.m_backend.data._M_elems[2];
              local_178._12_4_ = local_d8.m_backend.data._M_elems[3];
              local_178._0_4_ = local_d8.m_backend.data._M_elems[0];
              local_178._4_4_ = local_d8.m_backend.data._M_elems[1];
              auVar7 = local_178;
              local_148[0] = local_d8.m_backend.data._M_elems[0xc];
              local_148[1] = local_d8.m_backend.data._M_elems[0xd];
              stack0xfffffffffffffec0 = local_d8.m_backend.data._M_elems._56_5_;
              uStack_13b = local_d8.m_backend.data._M_elems[0xf]._1_3_;
              local_158._8_4_ = local_d8.m_backend.data._M_elems[10];
              local_158._12_4_ = local_d8.m_backend.data._M_elems[0xb];
              local_158._0_4_ = local_d8.m_backend.data._M_elems[8];
              local_158._4_4_ = local_d8.m_backend.data._M_elems[9];
              local_168._8_4_ = local_d8.m_backend.data._M_elems[6];
              local_168._12_4_ = local_d8.m_backend.data._M_elems[7];
              local_168._0_4_ = local_d8.m_backend.data._M_elems[4];
              local_168._4_4_ = local_d8.m_backend.data._M_elems[5];
              iStack_138 = local_d8.m_backend.exp;
              bStack_134 = local_d8.m_backend.neg;
              local_130._0_4_ = local_d8.m_backend.fpclass;
              local_130._4_4_ = local_d8.m_backend.prec_elem;
              local_178._0_4_ = local_d8.m_backend.data._M_elems[0];
              if (local_178._0_4_ != 0 || local_d8.m_backend.fpclass != cpp_dec_float_finite) {
                bStack_134 = (bool)(local_d8.m_backend.neg ^ 1);
              }
              local_178 = auVar7;
              if ((local_d8.m_backend.fpclass != cpp_dec_float_NaN) &&
                 (pcVar11->fpclass != cpp_dec_float_NaN)) {
                iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (pcVar11,(cpp_dec_float<100U,_int,_void> *)local_178);
                if (iVar8 < 0) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (&pnVar1->m_backend,
                             &(this->theCoTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend);
                }
              }
            }
            pnVar4 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((*(fpclass_type *)((long)(pnVar4 + iVar9) + 0x48) == cpp_dec_float_NaN) ||
               (pnVar5 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               pnVar5[iVar9].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_003cd8c6:
              pnVar4 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar5 = (this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&pnVar4[iVar9].m_backend,&pnVar5[iVar9].m_backend);
              if (iVar8 < 1) goto LAB_003cd8c6;
              pnVar4 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar5 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            pcVar11 = &pnVar4[iVar9].m_backend;
            local_130._0_4_ = cpp_dec_float_finite;
            local_130._4_4_ = 0x10;
            local_178 = (undefined1  [16])0x0;
            local_168 = (undefined1  [16])0x0;
            local_158 = (undefined1  [16])0x0;
            local_148[0] = 0;
            local_148[1] = 0;
            stack0xfffffffffffffec0 = 0;
            uStack_13b = 0;
            iStack_138 = 0;
            bStack_134 = false;
            if ((cpp_dec_float<100U,_int,_void> *)local_178 == &pnVar5[iVar9].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_178,pcVar11);
              if (local_178._0_4_ != 0 || (fpclass_type)local_130 != cpp_dec_float_finite) {
                bStack_134 = (bool)(bStack_134 ^ 1);
              }
            }
            else {
              if ((cpp_dec_float<100U,_int,_void> *)local_178 != pcVar11) {
                local_178 = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
                local_168 = *(undefined1 (*) [16])((pcVar11->data)._M_elems + 4);
                local_158 = *(undefined1 (*) [16])((pcVar11->data)._M_elems + 8);
                local_148._0_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 0xc);
                uVar6 = *(undefined8 *)((pcVar11->data)._M_elems + 0xe);
                stack0xfffffffffffffec0 = (undefined5)uVar6;
                uStack_13b = (undefined3)((ulong)uVar6 >> 0x28);
                iStack_138 = pcVar11->exp;
                bStack_134 = pcVar11->neg;
                local_130._0_4_ = pcVar11->fpclass;
                local_130._4_4_ = pcVar11->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_178,&pnVar5[iVar9].m_backend);
            }
            pnVar4 = (this->theCoTest).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)&pnVar4[iVar9].m_backend.data + 0x30);
            *(undefined8 *)puVar2 = local_148._0_8_;
            *(ulong *)(puVar2 + 2) = CONCAT35(uStack_13b,stack0xfffffffffffffec0);
            puVar2 = (uint *)((long)&pnVar4[iVar9].m_backend.data + 0x20);
            *(undefined8 *)puVar2 = local_158._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_158._8_8_;
            puVar2 = (uint *)((long)&pnVar4[iVar9].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = local_168._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_168._8_8_;
            *(undefined8 *)&pnVar4[iVar9].m_backend.data = local_178._0_8_;
            *(undefined8 *)((long)&pnVar4[iVar9].m_backend.data + 8) = local_178._8_8_;
            pnVar4[iVar9].m_backend.exp = iStack_138;
            pnVar4[iVar9].m_backend.neg = bStack_134;
            pnVar4[iVar9].m_backend.fpclass = (fpclass_type)local_130;
            pnVar4[iVar9].m_backend.prec_elem = local_130._4_4_;
            if (this->sparsePricingLeave == true) {
              pcVar11 = &(this->theCoTest).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend;
              local_148[0] = local_d8.m_backend.data._M_elems[0xc];
              local_148[1] = local_d8.m_backend.data._M_elems[0xd];
              stack0xfffffffffffffec0 = local_d8.m_backend.data._M_elems._56_5_;
              uStack_13b = local_d8.m_backend.data._M_elems[0xf]._1_3_;
              iStack_138 = local_d8.m_backend.exp;
              bStack_134 = local_d8.m_backend.neg;
              local_130._0_4_ = local_d8.m_backend.fpclass;
              local_130._4_4_ = local_d8.m_backend.prec_elem;
              local_178._0_4_ = local_d8.m_backend.data._M_elems[0];
              if (local_178._0_4_ != 0 || local_d8.m_backend.fpclass != cpp_dec_float_finite) {
                bStack_134 = (bool)(local_d8.m_backend.neg ^ 1);
              }
              if ((local_d8.m_backend.fpclass != cpp_dec_float_NaN) &&
                 (pcVar11->fpclass != cpp_dec_float_NaN)) {
                iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (pcVar11,(cpp_dec_float<100U,_int,_void> *)local_178);
                if (iVar8 < 0) {
                  if (this->m_pricingViolUpToDate == true) {
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                              (&pnVar1->m_backend,
                               &(this->theCoTest).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend);
                  }
                  if ((this->isInfeasible).data[iVar9] == 0) {
                    DIdxSet::addIdx(local_88,iVar9);
                    (this->isInfeasible).data[iVar9] = 1;
                  }
                  goto LAB_003cdb64;
                }
              }
            }
            if (this->m_pricingViolUpToDate == true) {
              pcVar11 = &(this->theCoTest).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend;
              local_148[0] = local_d8.m_backend.data._M_elems[0xc];
              local_148[1] = local_d8.m_backend.data._M_elems[0xd];
              stack0xfffffffffffffec0 = local_d8.m_backend.data._M_elems._56_5_;
              uStack_13b = local_d8.m_backend.data._M_elems[0xf]._1_3_;
              iStack_138 = local_d8.m_backend.exp;
              bStack_134 = local_d8.m_backend.neg;
              local_130._0_4_ = local_d8.m_backend.fpclass;
              local_130._4_4_ = local_d8.m_backend.prec_elem;
              local_178._0_4_ = local_d8.m_backend.data._M_elems[0];
              if (local_178._0_4_ != 0 || local_d8.m_backend.fpclass != cpp_dec_float_finite) {
                bStack_134 = (bool)(local_d8.m_backend.neg ^ 1);
              }
              if ((local_d8.m_backend.fpclass != cpp_dec_float_NaN) &&
                 (pcVar11->fpclass != cpp_dec_float_NaN)) {
                iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (pcVar11,(cpp_dec_float<100U,_int,_void> *)local_178);
                if (iVar8 < 0) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&pnVar1->m_backend,
                             &(this->theCoTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend);
                }
              }
            }
          }
        }
LAB_003cdb64:
        lVar12 = lVar12 + 1;
        pSVar10 = this->solveVector3;
      } while (lVar12 < (pSVar10->super_IdxSet).num);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateFtest()
{
   const IdxSet& idx = theFvec->idx();
   VectorBase<R>& ftest = theCoTest;      // |== fTest()|
   assert(&ftest == &fTest());

   assert(type() == LEAVE);

   updateViols.clear();
   R theeps = entertol();

   for(int j = idx.size() - 1; j >= 0; --j)
   {
      int i = idx.index(j);

      if(m_pricingViolUpToDate && ftest[i] < -theeps)
         // violation was present before this iteration
         m_pricingViol += ftest[i];

      ftest[i] = ((*theFvec)[i] > theUBbound[i])
                 ? theUBbound[i] - (*theFvec)[i]
                 : (*theFvec)[i] - theLBbound[i];

      if(sparsePricingLeave && ftest[i] < -theeps)
      {
         assert(remainingRoundsLeave == 0);

         if(m_pricingViolUpToDate)
            m_pricingViol -= ftest[i];

         if(isInfeasible[i] == SPxPricer<R>::NOT_VIOLATED)
         {
            // this can cause problems - we cannot keep on adding indeces to infeasibilities,
            // because they are not deleted in hyper mode...
            //             if( !hyperPricingLeave )
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
         }

         if(hyperPricingLeave)
            updateViols.addIdx(i);
      }
      else if(m_pricingViolUpToDate && ftest[i] < -theeps)
         m_pricingViol -= ftest[i];
   }

   // if boundflips were performed, we need to update these indices as well
   if(boundflips > 0)
   {
      R eps = epsilon();

      for(int j = 0; j < solveVector3->size(); ++j)
      {
         if(spxAbs(solveVector3->value(j)) > eps)
         {
            int i = solveVector3->index(j);

            if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol += ftest[i];

            ftest[i] = ((*theFvec)[i] > theUBbound[i]) ? theUBbound[i] - (*theFvec)[i] :
                       (*theFvec)[i] - theLBbound[i];

            if(sparsePricingLeave && ftest[i] < -theeps)
            {
               assert(remainingRoundsLeave == 0);

               if(m_pricingViolUpToDate)
                  m_pricingViol -= ftest[i];

               if(!isInfeasible[i])
               {
                  infeasibilities.addIdx(i);
                  isInfeasible[i] = true;
               }
            }
            else if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol -= ftest[i];
         }
      }
   }
}